

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void executeTransaction(string *transbuffer,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *lockitem)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  *this_00;
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  long lVar8;
  SQLParserResult *pSVar9;
  size_t sVar10;
  InsertStatement *stmt;
  table *ptVar11;
  UpdateStatement *pUVar12;
  long *plVar13;
  fd_set *pfVar14;
  SelectStatement *stmt_00;
  undefined8 *puVar15;
  SQLStatement *pSVar16;
  ostream *poVar17;
  char *pcVar18;
  size_t sVar19;
  pointer pbVar20;
  long *plVar21;
  size_type *psVar22;
  fd_set *__writefds;
  ulong *puVar23;
  uint uVar24;
  uint i;
  uint uVar25;
  undefined8 uVar26;
  fd_set *__exceptfds;
  timeval *in_R9;
  uint i_2;
  uint i_1;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  int selectvalue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query;
  string temp_update_query;
  string select_item;
  string __str;
  string stable;
  string t_query;
  string select_query;
  string operation;
  string where;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  update_query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  querys;
  uint local_39c;
  pointer local_398;
  string local_390;
  string local_370;
  ulong local_350;
  string *local_348;
  long *local_340;
  long local_338;
  long local_330;
  long lStack_328;
  string local_320;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long lStack_2e8;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  timeval *local_2a0;
  long local_298;
  timeval local_290;
  undefined1 local_280 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_260;
  string local_258;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  string local_1f8;
  undefined1 *local_1d8;
  char *local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  string local_180;
  string local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [96];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
  local_60;
  
  uVar25 = 0;
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(local_f0 + 0x18);
  uVar28 = 1000;
  local_348 = transbuffer;
  local_260 = lockitem;
  while( true ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this,local_260);
    bVar2 = check_true_size(this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    if (bVar2) break;
    if (0 < (int)uVar28) {
      local_390._M_dataplus._M_p = (pointer)(uVar28 / 1000);
      local_390._M_string_length = (uVar28 % 1000) * 1000000;
      do {
        iVar4 = nanosleep((timespec *)&local_390,(timespec *)&local_390);
        if (iVar4 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
    }
    bVar2 = 2 < uVar25;
    uVar25 = uVar25 + 1;
    uVar24 = (int)uVar28 * 2;
    if (bVar2) {
      uVar24 = 1000;
    }
    uVar28 = (ulong)uVar24;
  }
  split(&local_140,local_348,';');
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398 = local_140.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_140.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_140.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00112029:
    local_348 = local_140.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_140.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_140.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_350 = 0;
      local_398 = (pointer)((ulong)local_398 & 0xffffffff00000000);
      pbVar20 = local_140.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        pcVar1 = (pbVar20->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_390,pcVar1,pcVar1 + pbVar20->_M_string_length);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        removespace(&local_258,&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        if (((local_258._M_string_length != 0) &&
            (lVar8 = std::__cxx11::string::find((char *)&local_390,0x1234cf,0), lVar8 == -1)) &&
           (lVar8 = std::__cxx11::string::find((char *)&local_390,0x123637,0), lVar8 == -1)) {
          std::__cxx11::string::append((char *)&local_390);
          pSVar9 = hsql::SQLParser::parseSQLString(&local_390);
          bVar2 = hsql::SQLParserResult::isValid(pSVar9);
          if (bVar2) {
            uVar28 = 0;
            while( true ) {
              sVar10 = hsql::SQLParserResult::size(pSVar9);
              if (sVar10 <= uVar28) break;
              pSVar16 = hsql::SQLParserResult::getMutableStatement(pSVar9,(int)uVar28);
              executeStatement(pSVar16,&table_list_abi_cxx11_);
              saveToFile(&table_list_abi_cxx11_);
              uVar28 = (ulong)((int)uVar28 + 1);
            }
          }
          else {
            lVar8 = std::__cxx11::string::find((char *)&local_390,0x123e2d,0);
            if (lVar8 != -1) {
              std::__cxx11::string::_M_assign((string *)&local_390);
              local_398 = (pointer)CONCAT44(local_398._4_4_,(int)local_398 + 1);
              local_350 = (ulong)((int)local_350 + 1);
            }
            pSVar9 = hsql::SQLParser::parseSQLString(&local_390);
            bVar2 = hsql::SQLParserResult::isValid(pSVar9);
            if (bVar2) {
              uVar28 = 0;
              while( true ) {
                sVar10 = hsql::SQLParserResult::size(pSVar9);
                if (sVar10 <= uVar28) break;
                pSVar16 = hsql::SQLParserResult::getMutableStatement(pSVar9,(int)uVar28);
                executeStatement(pSVar16,&table_list_abi_cxx11_);
                saveToFile(&table_list_abi_cxx11_);
                uVar28 = (ulong)((int)uVar28 + 1);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Given string is not a valid SQL query.",0x26);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              poVar17 = (ostream *)std::ostream::flush();
              pcVar18 = hsql::SQLParserResult::errorMsg(pSVar9);
              if (pcVar18 == (char *)0x0) {
                std::ios::clear((int)poVar17 + (int)*(undefined8 *)(*(long *)poVar17 + -0x18));
              }
              else {
                sVar19 = strlen(pcVar18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar18,sVar19);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"(",1);
              iVar4 = hsql::SQLParserResult::errorLine(pSVar9);
              poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,":",1);
              iVar4 = hsql::SQLParserResult::errorColumn(pSVar9);
              poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
              std::ostream::put((char)poVar17);
              std::ostream::flush();
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p);
        }
        pbVar20 = pbVar20 + 1;
      } while (pbVar20 != local_348);
      goto LAB_00112379;
    }
  }
  else {
    uVar25 = 1;
    pbVar20 = local_140.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      pcVar1 = (pbVar20->_M_dataplus)._M_p;
      local_348 = pbVar20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_390,pcVar1,pcVar1 + pbVar20->_M_string_length);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      removespace(&local_258,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      cVar3 = '\x05';
      if (local_258._M_string_length != 0) {
        lVar8 = std::__cxx11::string::find((char *)&local_390,0x1234cf,0);
        if ((lVar8 == -1) &&
           (lVar8 = std::__cxx11::string::find((char *)&local_390,0x123637,0), lVar8 == -1)) {
          std::__cxx11::string::append((char *)&local_390);
          pSVar9 = hsql::SQLParser::parseSQLString(&local_390);
          bVar2 = hsql::SQLParserResult::isValid(pSVar9);
          if (bVar2) {
            uVar28 = 0;
            while( true ) {
              sVar10 = hsql::SQLParserResult::size(pSVar9);
              iVar4 = (int)uVar28;
              if (sVar10 <= uVar28) break;
              lVar8 = std::__cxx11::string::find((char *)&local_390,0x120dd2,0);
              if (lVar8 != -1) {
                stmt = (InsertStatement *)hsql::SQLParserResult::getMutableStatement(pSVar9,iVar4);
                std::__cxx11::string::string
                          ((string *)&local_320,stmt->tableName,(allocator *)local_280);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                ::_Rb_tree(&local_60,&table_list_abi_cxx11_._M_t);
                ptVar11 = util::getTable(&local_320,
                                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                                          *)&local_60);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                ::~_Rb_tree(&local_60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                  operator_delete(local_320._M_dataplus._M_p);
                }
                if (ptVar11 == (table *)0x0) {
                  uVar25 = 0;
                }
                else {
                  bVar2 = table::insertcheck(ptVar11,stmt);
                  uVar25 = uVar25 & 0xff;
                  if (!bVar2) {
                    uVar25 = 0;
                  }
                }
              }
              lVar8 = std::__cxx11::string::find((char *)&local_390,0x123e2d,0);
              if (lVar8 != -1) {
                pUVar12 = (UpdateStatement *)
                          hsql::SQLParserResult::getMutableStatement(pSVar9,iVar4);
                std::__cxx11::string::string
                          ((string *)&local_320,pUVar12->table->name,(allocator *)local_280);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                ::_Rb_tree(&local_90,&table_list_abi_cxx11_._M_t);
                ptVar11 = util::getTable(&local_320,
                                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                                          *)&local_90);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                ::~_Rb_tree(&local_90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                  operator_delete(local_320._M_dataplus._M_p);
                }
                if ((ptVar11 == (table *)0x0) ||
                   (bVar2 = table::updatecheck(ptVar11,pUVar12), !bVar2)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"cannot update this statement",0x1c);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                  std::ostream::put('p');
                  std::ostream::flush();
                  uVar25 = 0;
                }
              }
              uVar28 = (ulong)(iVar4 + 1);
            }
          }
          else {
            lVar8 = std::__cxx11::string::find((char *)&local_390,0x123e2d,0);
            if (lVar8 == -1) {
              uVar25 = 0;
            }
            else {
              lVar8 = std::__cxx11::string::find((char *)&local_390,0x12365b,0);
              uVar25 = uVar25 & 0xff;
              if (lVar8 != -1) {
                uVar25 = 0;
              }
              local_350 = CONCAT44(local_350._4_4_,uVar25);
              std::__cxx11::string::find((char *)&local_390,0x123667,0);
              std::__cxx11::string::find((char *)&local_390,0x120b96,0);
              std::__cxx11::string::find((char *)&local_390,0x123667,0);
              std::__cxx11::string::substr((ulong)&local_320,(ulong)&local_390);
              split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_280,&local_320,'=');
              std::__cxx11::string::_M_assign((string *)&local_320);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_280);
              std::__cxx11::string::find((char *)&local_390,0x123e2d,0);
              std::__cxx11::string::find((char *)&local_390,0x123667,0);
              std::__cxx11::string::find((char *)&local_390,0x123e2d,0);
              std::__cxx11::string::substr((ulong)local_280,(ulong)&local_390);
              std::__cxx11::string::find((char *)&local_390,0x120b96,0);
              std::__cxx11::string::find((char *)&local_390,0x123511,0);
              std::__cxx11::string::find((char *)&local_390,0x120b96,0);
              std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_390);
              local_1d8 = local_1c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
              pcVar18 = "-";
              lVar8 = std::__cxx11::string::find((char *)&local_390,0x12366b,0);
              if (lVar8 == -1) {
                pcVar18 = "+";
              }
              __exceptfds = (fd_set *)0x1;
              std::__cxx11::string::_M_replace((ulong)&local_1d8,0,local_1d0,(ulong)pcVar18);
              std::operator+(&local_2c0,"select ",&local_320);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_2c0);
              plVar21 = plVar13 + 2;
              if ((long *)*plVar13 == plVar21) {
                local_330 = *plVar21;
                lStack_328 = plVar13[3];
                local_340 = &local_330;
              }
              else {
                local_330 = *plVar21;
                local_340 = (long *)*plVar13;
              }
              local_338 = plVar13[1];
              *plVar13 = (long)plVar21;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_340,local_280._0_8_);
              local_300 = &local_2f0;
              plVar21 = plVar13 + 2;
              if ((long *)*plVar13 == plVar21) {
                local_2f0 = *plVar21;
                lStack_2e8 = plVar13[3];
              }
              else {
                local_2f0 = *plVar21;
                local_300 = (long *)*plVar13;
              }
              local_2f8 = plVar13[1];
              *plVar13 = (long)plVar21;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_300);
              local_2e0 = &local_2d0;
              plVar21 = plVar13 + 2;
              if ((long *)*plVar13 == plVar21) {
                local_2d0 = *plVar21;
                lStack_2c8 = plVar13[3];
              }
              else {
                local_2d0 = *plVar21;
                local_2e0 = (long *)*plVar13;
              }
              local_2d8 = plVar13[1];
              *plVar13 = (long)plVar21;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_2e0,(ulong)local_1b8[0]);
              psVar22 = (size_type *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar22) {
                local_370.field_2._M_allocated_capacity = *psVar22;
                local_370.field_2._8_8_ = plVar13[3];
                local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
              }
              else {
                local_370.field_2._M_allocated_capacity = *psVar22;
                local_370._M_dataplus._M_p = (pointer)*plVar13;
              }
              local_370._M_string_length = plVar13[1];
              *plVar13 = (long)psVar22;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_370);
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              psVar22 = (size_type *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar22) {
                local_1f8.field_2._M_allocated_capacity = *psVar22;
                local_1f8.field_2._8_8_ = plVar13[3];
              }
              else {
                local_1f8.field_2._M_allocated_capacity = *psVar22;
                local_1f8._M_dataplus._M_p = (pointer)*plVar13;
              }
              local_1f8._M_string_length = plVar13[1];
              *plVar13 = (long)psVar22;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370._M_dataplus._M_p != &local_370.field_2) {
                operator_delete(local_370._M_dataplus._M_p);
              }
              if (local_2e0 != &local_2d0) {
                operator_delete(local_2e0);
              }
              if (local_300 != &local_2f0) {
                operator_delete(local_300);
              }
              if (local_340 != &local_330) {
                operator_delete(local_340);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                operator_delete(local_2c0._M_dataplus._M_p);
              }
              local_39c = 0xffffffff;
              pSVar9 = hsql::SQLParser::parseSQLString(&local_1f8);
              bVar2 = hsql::SQLParserResult::isValid(pSVar9);
              __writefds = (fd_set *)0x0;
              uVar24 = 0;
              if (bVar2) {
                uVar24 = (uint)local_350;
                while( true ) {
                  pfVar14 = (fd_set *)hsql::SQLParserResult::size(pSVar9);
                  iVar4 = (int)__writefds;
                  if (pfVar14 <= __writefds) break;
                  stmt_00 = (SelectStatement *)
                            hsql::SQLParserResult::getMutableStatement(pSVar9,iVar4);
                  if (stmt_00->fromTable->type == kTableName) {
                    std::__cxx11::string::string
                              ((string *)&local_370,stmt_00->fromTable->name,(allocator *)&local_2e0
                              );
                    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                               *)(local_f0 + 0x30);
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                    ::_Rb_tree(this_00,&table_list_abi_cxx11_._M_t);
                    ptVar11 = util::getTable(&local_370,
                                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                                              *)this_00);
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_table_*>_>_>
                    ::~_Rb_tree(this_00);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_370._M_dataplus._M_p != &local_370.field_2) {
                      operator_delete(local_370._M_dataplus._M_p);
                    }
                    if (ptVar11 == (table *)0x0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"did not find table ",0x13);
                      pcVar18 = stmt_00->fromTable->name;
                      if (pcVar18 == (char *)0x0) {
                        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12d270);
                      }
                      else {
                        sVar19 = strlen(pcVar18);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,pcVar18,sVar19);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout," from database",0xe);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                      std::ostream::put('p');
                      std::ostream::flush();
                      uVar24 = 0;
                    }
                    else {
                      table::select_abi_cxx11_
                                ((table *)local_f0,(int)ptVar11,(fd_set *)stmt_00,__writefds,
                                 __exceptfds,in_R9);
                      util::PrintRecords(stmt_00,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                                                  *)local_f0,ptVar11,(int *)&local_39c);
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                                 *)local_f0);
                      iVar5 = std::__cxx11::string::compare((char *)&local_1d8);
                      local_39c = local_39c + (-(uint)(iVar5 == 0) | 1);
                      uVar24 = uVar24 & 0xff;
                      if ((int)local_39c < 0) {
                        uVar24 = 0;
                      }
                    }
                  }
                  __writefds = (fd_set *)(ulong)(iVar4 + 1);
                }
              }
              std::operator+(&local_110,"update ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_280);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_110);
              local_238 = &local_228;
              plVar21 = plVar13 + 2;
              if ((long *)*plVar13 == plVar21) {
                local_228 = *plVar21;
                lStack_220 = plVar13[3];
              }
              else {
                local_228 = *plVar21;
                local_238 = (long *)*plVar13;
              }
              local_230 = plVar13[1];
              *plVar13 = (long)plVar21;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_238,(ulong)local_320._M_dataplus._M_p);
              local_218 = &local_208;
              plVar21 = plVar13 + 2;
              if ((long *)*plVar13 == plVar21) {
                local_208 = *plVar21;
                lStack_200 = plVar13[3];
              }
              else {
                local_208 = *plVar21;
                local_218 = (long *)*plVar13;
              }
              local_210 = plVar13[1];
              *plVar13 = (long)plVar21;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_218);
              puVar23 = (ulong *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_2c0.field_2._M_allocated_capacity = *puVar23;
                local_2c0.field_2._8_8_ = plVar13[3];
                local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
              }
              else {
                local_2c0.field_2._M_allocated_capacity = *puVar23;
                local_2c0._M_dataplus._M_p = (pointer)*plVar13;
              }
              local_2c0._M_string_length = plVar13[1];
              *plVar13 = (long)puVar23;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              uVar25 = -local_39c;
              if (0 < (int)local_39c) {
                uVar25 = local_39c;
              }
              uVar27 = 1;
              if (9 < uVar25) {
                uVar28 = (ulong)uVar25;
                uVar29 = 4;
                do {
                  uVar27 = uVar29;
                  uVar6 = (uint)uVar28;
                  if (uVar6 < 100) {
                    uVar27 = uVar27 - 2;
                    goto LAB_00111bd8;
                  }
                  if (uVar6 < 1000) {
                    uVar27 = uVar27 - 1;
                    goto LAB_00111bd8;
                  }
                  if (uVar6 < 10000) goto LAB_00111bd8;
                  uVar28 = uVar28 / 10000;
                  uVar29 = uVar27 + 4;
                } while (99999 < uVar6);
                uVar27 = uVar27 + 1;
              }
LAB_00111bd8:
              uVar29 = local_39c >> 0x1f;
              local_2a0 = &local_290;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_2a0,(char)uVar27 - (char)((int)local_39c >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((long)&local_2a0->tv_sec + (ulong)uVar29),uVar27,uVar25);
              uVar26 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                uVar26 = local_2c0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar26 < local_298 + local_2c0._M_string_length) {
                in_R9 = &local_290;
                uVar28 = 0xf;
                if (local_2a0 != in_R9) {
                  uVar28 = local_290.tv_sec;
                }
                if (uVar28 < local_298 + local_2c0._M_string_length) goto LAB_00111c8e;
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_2a0,0,(char *)0x0,
                                     (ulong)local_2c0._M_dataplus._M_p);
              }
              else {
LAB_00111c8e:
                puVar15 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_2a0);
              }
              plVar13 = puVar15 + 2;
              if ((long *)*puVar15 == plVar13) {
                local_330 = *plVar13;
                lStack_328 = puVar15[3];
                local_340 = &local_330;
              }
              else {
                local_330 = *plVar13;
                local_340 = (long *)*puVar15;
              }
              local_338 = puVar15[1];
              *puVar15 = plVar13;
              puVar15[1] = 0;
              *(undefined1 *)plVar13 = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_340);
              plVar21 = plVar13 + 2;
              if ((long *)*plVar13 == plVar21) {
                local_2f0 = *plVar21;
                lStack_2e8 = plVar13[3];
                local_300 = &local_2f0;
              }
              else {
                local_2f0 = *plVar21;
                local_300 = (long *)*plVar13;
              }
              local_2f8 = plVar13[1];
              *plVar13 = (long)plVar21;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_300,(ulong)local_1b8[0]);
              plVar21 = plVar13 + 2;
              if ((long *)*plVar13 == plVar21) {
                local_2d0 = *plVar21;
                lStack_2c8 = plVar13[3];
                local_2e0 = &local_2d0;
              }
              else {
                local_2d0 = *plVar21;
                local_2e0 = (long *)*plVar13;
              }
              local_2d8 = plVar13[1];
              *plVar13 = (long)plVar21;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_2e0);
              local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
              psVar22 = (size_type *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar22) {
                local_370.field_2._M_allocated_capacity = *psVar22;
                local_370.field_2._8_8_ = plVar13[3];
              }
              else {
                local_370.field_2._M_allocated_capacity = *psVar22;
                local_370._M_dataplus._M_p = (pointer)*plVar13;
              }
              local_370._M_string_length = plVar13[1];
              *plVar13 = (long)psVar22;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              if (local_2e0 != &local_2d0) {
                operator_delete(local_2e0);
              }
              if (local_300 != &local_2f0) {
                operator_delete(local_300);
              }
              if (local_340 != &local_330) {
                operator_delete(local_340);
              }
              if (local_2a0 != &local_290) {
                operator_delete(local_2a0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                operator_delete(local_2c0._M_dataplus._M_p);
              }
              if (local_218 != &local_208) {
                operator_delete(local_218);
              }
              if (local_238 != &local_228) {
                operator_delete(local_238);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_198,&local_370);
              pSVar9 = hsql::SQLParser::parseSQLString(&local_370);
              bVar2 = hsql::SQLParserResult::isValid(pSVar9);
              uVar25 = 0;
              uVar27 = uVar25;
              if (bVar2) {
                for (; uVar25 = uVar24, sVar10 = hsql::SQLParserResult::size(pSVar9),
                    uVar27 < sVar10; uVar27 = uVar27 + 1) {
                  pUVar12 = (UpdateStatement *)
                            hsql::SQLParserResult::getMutableStatement(pSVar9,uVar27);
                  bVar2 = executeUpdate(pUVar12,&table_list_abi_cxx11_,true);
                  uVar24 = uVar25 & 0xff;
                  if (!bVar2) {
                    uVar24 = 0;
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370._M_dataplus._M_p != &local_370.field_2) {
                operator_delete(local_370._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p);
              }
              if (local_1d8 != local_1c8) {
                operator_delete(local_1d8);
              }
              if (local_1b8[0] != local_1a8) {
                operator_delete(local_1b8[0]);
              }
              if ((pointer)local_280._0_8_ != (pointer)(local_280 + 0x10)) {
                operator_delete((void *)local_280._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p);
              }
            }
          }
          cVar3 = (~(byte)uVar25 & 1) << 2;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p);
      }
    } while (((cVar3 == '\x05') || (cVar3 == '\0')) &&
            (pbVar20 = local_348 + 1, pbVar20 != local_398));
    if ((uVar25 & 1) != 0) goto LAB_00112029;
  }
  local_398 = (pointer)((ulong)local_398 & 0xffffffff00000000);
LAB_00112379:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_128,local_260);
  unlock_items(&local_128,(int)local_398);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  return;
}

Assistant:

void executeTransaction(string transbuffer, vector<string> lockitem){
//    //check queue if thread in or out
    //lock on the record
//    con.lock();
//    for(auto item: lockitem) {
//        int sleep_time = 1000;
//        while (true) {
//            //con.lock();
//            //cout << item << "condition is : " << locks[item]<<endl;
//            if (locks.find(item) != locks.end() && locks[item] == 0) {
//                locks[item] = 1;
//                //con.unlock();
//                break;
//            }
//            if (locks.find(item) == locks.end()) {
//                locks.insert(make_pair(item, 1));
//                //con.unlock();
//                break;
//            }
//
//        }
//
//        this_thread::sleep_for(chrono::milliseconds(sleep_time));
//        sleep_time *= 2;
//    }
//
//    con.unlock();

    int sleep_time = 1000;
    int sleep_count = 0;
    while(true){
        if(check_true_size(lockitem)){
            break;
        }
        sleep_count++;
        //int v2 = rand() % 1000 + 1;
        this_thread::sleep_for(chrono::milliseconds(sleep_time));
        if(sleep_count > 3){
            sleep_time = 1000;
        }
        else{
            sleep_time *= 2;
        }
    }



    //threads_id.push(this_thread::get_id());

//    string previous_item = "";
//
//    //lock
//    con.lock();
//    while(true){
//
//        int true_size = 0;
//        map<string, int> temp_locks;
//
//        for(auto item: lockitem) {
//
//            if(item == previous_item){
//                previous_item = item;
//                true_size++;
//                continue;
//            }
//            else if(locks.find(item) != locks.end() && locks[item] == 0)
//            {
//                temp_locks[item] = 1;
//                locks[item] = 1;
//                true_size++;
//                previous_item = item;
//                continue;
//            }
//
//            else if(locks.find(item) == locks.end()){
//
//                temp_locks[item] = 1;
//                locks.insert(make_pair(item, 1));
//                true_size++;
//                previous_item = item;
//                continue;
//            }
//            previous_item = item;
//        }
//        if(true_size == lockitem.size()){
//            con.unlock();
//            break;
//        }
//        else {
//            for (std::map<string, int>::iterator it = temp_locks.begin(); it != temp_locks.end(); ++it) {
//                if (it->second == 1) {
//                    locks[it->first] = 0;
//                }
//            }
//        }
//        //int v2 = rand() % 1000 + 1;
//        this_thread::sleep_for(chrono::milliseconds(1000));
//    }

    //unlock
    //con.unlock();

    //check if the transbuffer can be executed.
    vector<string> querys = split(transbuffer, ';');
    bool cancommit = true;
    vector<string> update_query;

    for(auto query : querys){

        string t_query = removespace(query);
        if(t_query.length() < 1)
            continue;
        if(query.find("end transaction") != string::npos || query.find("commit") != string::npos)
            continue;

        query += ";";
        hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(query);
        // check whether the parsing was successful
        if (result->isValid()) {
            for (unsigned i = 0; i < result->size(); ++i) {
                //run sql query


                //check insert
                if(query.find("insert") != string::npos){

                    hsql::InsertStatement *stmt = (hsql::InsertStatement*)result->getMutableStatement(i);
                    table* totable = util::getTable(stmt->tableName, table_list);
                    if(totable == NULL)
                        cancommit = false;
                    if(totable != NULL && !totable->insertcheck(stmt))
                        cancommit = false;

                }

                if(query.find("update") != string::npos){
                    hsql::UpdateStatement *stmt = (hsql::UpdateStatement*)result->getMutableStatement(i);
                    table* totable = util::getTable(stmt->table->name, table_list);
                    if(totable == NULL)
                    {
                        cout << "cannot update this statement"<< endl;
                        cancommit = false;
                    }
                    if(totable != NULL && !totable->updatecheck(stmt))
                    {
                        cout << "cannot update this statement"<< endl;
                        cancommit = false;
                    }

                }


            }
        } else {

            //split update to two querys and check again
            if(query.find("update") != string::npos ){
                if(query.find("insert into") != string::npos )
                    cancommit = false;;
                string select_item = query.substr(query.find("set") + 3, query.find("where") - query.find("set") - 3);
                select_item = split(select_item, '=')[0];
                string stable = query.substr(query.find("update") + 6, query.find("set") - query.find("update") -6);
                string where = query.substr(query.find("where") + 5, query.find(";") - query.find("where") - 5);
                string operation = "";
                if(query.find("-")!= string::npos)
                    operation="-";
                else
                    operation="+";


                string select_query = "select " + select_item + " from " + stable + " where " + where + ";";


                //select query
                int selectvalue = -1;
                hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(select_query);
                if (result->isValid()) {
                    for (unsigned i = 0; i < result->size(); ++i) {
                        //run sql query
                        hsql::SelectStatement *stmt = (hsql::SelectStatement*)result->getMutableStatement(i);
                        if(stmt->fromTable->type == hsql::kTableName){
                            table* totable = util::getTable(stmt->fromTable->name, table_list);
                            if(totable == NULL){
                                cout<< "did not find table " << stmt->fromTable->name << " from database"<<endl;
                                cancommit = false;
                            }

                            if(totable != nullptr) {
                                util::PrintRecords(stmt, totable->select(stmt), totable, selectvalue);
                                if(operation == "-")
                                    selectvalue -= 1;
                                else
                                    selectvalue += 1;
                                if(selectvalue < 0)
                                    cancommit = false;

                            }
                        }

                    }
                } else {
                    //cout << "Given string is not a valid SQL query." << endl
                     //    << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                    cancommit = false;
                }
                //update query
                string temp_update_query = "update " + stable + " set " + select_item + " = " + to_string(selectvalue) + " where " + where + ";";
                update_query.push_back(temp_update_query);
                result = hsql::SQLParser::parseSQLString(temp_update_query);
                if (result->isValid()) {
                    for (unsigned i = 0; i < result->size(); ++i) {
                        //run sql query
                        hsql::UpdateStatement *stmt = (hsql::UpdateStatement*)result->getMutableStatement(i);
                        if(!executeUpdate(stmt, table_list, true)){
                            cancommit = false;
                        }
                    }
                } else {
                    //cout << "Given string is not a valid SQL query." << endl
                     //    << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                    cancommit = false;
                }


            }
            else{
                //cout << "Given string is not a valid SQL query." << endl
                 //    << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                cancommit = false;
            }


        }

        //cout << "find query" << query << endl;
        if(cancommit == false)
            break;
    }


    //commit
    int numberOfRowsModified = 0;
    if(cancommit){
        //cout << "do commit" << endl;
        int countupdate = 0;
        for(auto query: querys){
            //cout << "query: " << query << endl;
            string t_query = removespace(query);
            if(t_query.length() < 1)
                continue;
            if(query.find("end transaction") != string::npos || query.find("commit") != string::npos)
                continue;

            query += ";";
            hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(query);

            // check whether the parsing was successful
            if (result->isValid()) {
                for (unsigned i = 0; i < result->size(); ++i) {
                    //run sql query
                    executeStatement(result->getMutableStatement(i), table_list);
                    saveToFile(table_list);

                }
            } else {
                if(query.find("update") != string::npos){
                    numberOfRowsModified++;
                    query = update_query[countupdate];
                    countupdate += 1;
                }
                hsql::SQLParserResult *result = hsql::SQLParser::parseSQLString(query);

                // check whether the parsing was successful
                if (result->isValid()) {
                    for (unsigned i = 0; i < result->size(); ++i) {
                        //run sql query
                        executeStatement(result->getMutableStatement(i), table_list);
                        saveToFile(table_list);
                    }
                }
                else{
                    cout << "Given string is not a valid SQL query." << endl
                         << result->errorMsg() << "(" << result->errorLine() << ":" << result->errorColumn() << ")" << endl;
                }

            }

        }
    }

    //execute the transbuffr
    unlock_items(lockitem, numberOfRowsModified);



}